

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O2

void unblock_point(int x,int y)

{
  char cVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  long lVar8;
  
  lVar2 = (long)y;
  lVar3 = (long)x;
  if (viz_clear[lVar2][lVar3] == '\0') {
    viz_clear[lVar2][lVar3] = '\x01';
    if (x == 0x4f) {
      if (viz_clear[lVar2][0x4e] == '\0') {
        left_ptrs[lVar2][0x4f] = 'N';
        for (lVar6 = (long)left_ptrs[lVar2][0x4e]; lVar6 < 0x4f; lVar6 = lVar6 + 1) {
          right_ptrs[lVar2][lVar6] = 'N';
        }
      }
      else {
        left_ptrs[lVar2][0x4f] = left_ptrs[lVar2][0x4e];
      }
    }
    else if (x == 0) {
      if (viz_clear[lVar2][1] == '\0') {
        right_ptrs[lVar2][0] = '\x01';
        cVar1 = right_ptrs[lVar2][1];
        for (lVar6 = 1; lVar6 <= cVar1; lVar6 = lVar6 + 1) {
          left_ptrs[lVar2][lVar6] = '\x01';
        }
      }
      else {
        right_ptrs[lVar2][0] = right_ptrs[lVar2][1];
      }
    }
    else {
      lVar8 = (long)x;
      cVar7 = (char)x + -1;
      lVar6 = lVar8 + 1;
      cVar1 = viz_clear[lVar2][lVar8 + 1];
      cVar4 = (char)lVar6;
      if (viz_clear[lVar2 + -1][lVar8 + 0x4f] == '\0') {
        lVar8 = (long)left_ptrs[lVar2 + -1][lVar8 + 0x4f];
        if (cVar1 == '\0') {
          for (; lVar8 < lVar3; lVar8 = lVar8 + 1) {
            right_ptrs[lVar2][lVar8] = cVar7;
          }
          cVar1 = right_ptrs[lVar2][lVar6];
          for (; lVar6 <= cVar1; lVar6 = lVar6 + 1) {
            left_ptrs[lVar2][lVar6] = cVar4;
          }
          left_ptrs[lVar2][lVar3] = cVar7;
          right_ptrs[lVar2][lVar3] = cVar4;
        }
        else {
          for (; lVar8 < lVar3; lVar8 = lVar8 + 1) {
            right_ptrs[lVar2][lVar8] = cVar7;
          }
          cVar1 = right_ptrs[lVar2][lVar6];
          for (lVar6 = lVar3; lVar6 <= cVar1; lVar6 = lVar6 + 1) {
            if (viz_clear[lVar2][lVar6] != '\0') {
              left_ptrs[lVar2][lVar6] = cVar7;
            }
          }
          right_ptrs[lVar2][lVar3] = cVar1;
        }
      }
      else if (cVar1 == '\0') {
        cVar1 = right_ptrs[lVar2][lVar6];
        for (; lVar6 <= cVar1; lVar6 = lVar6 + 1) {
          left_ptrs[lVar2][lVar6] = cVar4;
        }
        cVar1 = left_ptrs[lVar2 + -1][lVar8 + 0x4f];
        for (lVar6 = (long)cVar1; lVar6 <= lVar3; lVar6 = lVar6 + 1) {
          if (viz_clear[lVar2][lVar6] != '\0') {
            right_ptrs[lVar2][lVar6] = cVar4;
          }
        }
        left_ptrs[lVar2][lVar3] = cVar1;
      }
      else {
        cVar1 = left_ptrs[lVar2 + -1][lVar8 + 0x4f];
        pcVar5 = (char *)(lVar8 + 0x358081 + lVar2 * 0x50);
        for (lVar6 = (long)cVar1; lVar6 <= lVar3; lVar6 = lVar6 + 1) {
          if (viz_clear[lVar2][lVar6] != '\0') {
            right_ptrs[lVar2][lVar6] = *pcVar5;
          }
        }
        cVar4 = *pcVar5;
        for (lVar6 = lVar3; lVar6 <= cVar4; lVar6 = lVar6 + 1) {
          if (viz_clear[lVar2][lVar6] != '\0') {
            left_ptrs[lVar2][lVar6] = cVar1;
          }
        }
      }
    }
  }
  if (viz_array[lVar2][lVar3] != '\0') {
    vision_full_recalc = '\x01';
  }
  return;
}

Assistant:

static void dig_point(int row, int col)
{
    int i;

    if (viz_clear[row][col]) return;		/* already done */

    viz_clear[row][col] = 1;

    /*
     * Boundary cases first.
     */
    if (col == 0) {				/* left edge */
	if (viz_clear[row][1]) {
	    right_ptrs[row][0] = right_ptrs[row][1];
	} else {
	    right_ptrs[row][0] = 1;
	    for (i = 1; i <= right_ptrs[row][1]; i++)
		left_ptrs[row][i] = 1;
	}
    } else if (col == (COLNO-1)) {		/* right edge */

	if (viz_clear[row][COLNO-2]) {
	    left_ptrs[row][COLNO-1] = left_ptrs[row][COLNO-2];
	} else {
	    left_ptrs[row][COLNO-1] = COLNO-2;
	    for (i = left_ptrs[row][COLNO-2]; i < COLNO-1; i++)
		right_ptrs[row][i] = COLNO-2;
	}
    }

    /*
     * At this point, we know we aren't on the boundaries.
     */
    else if (viz_clear[row][col-1] && viz_clear[row][col+1]) {
	/* Both sides clear */
	for (i = left_ptrs[row][col-1]; i <= col; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    right_ptrs[row][i] = right_ptrs[row][col+1];
	}
	for (i = col; i <= right_ptrs[row][col+1]; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    left_ptrs[row][i] = left_ptrs[row][col-1];
	}

    } else if (viz_clear[row][col-1]) {
	/* Left side clear, right side blocked. */
	for (i = col+1; i <= right_ptrs[row][col+1]; i++)
	    left_ptrs[row][i] = col+1;

	for (i = left_ptrs[row][col-1]; i <= col; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    right_ptrs[row][i] = col+1;
	}
	left_ptrs[row][col] = left_ptrs[row][col-1];

    } else if (viz_clear[row][col+1]) {
	/* Right side clear, left side blocked. */
	for (i = left_ptrs[row][col-1]; i < col; i++)
	    right_ptrs[row][i] = col-1;

	for (i = col; i <= right_ptrs[row][col+1]; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    left_ptrs[row][i] = col-1;
	}
	right_ptrs[row][col] = right_ptrs[row][col+1];

    } else {
	/* Both sides blocked */
	for (i = left_ptrs[row][col-1]; i < col; i++)
	    right_ptrs[row][i] = col-1;

	for (i = col+1; i <= right_ptrs[row][col+1]; i++)
	    left_ptrs[row][i] = col+1;

	left_ptrs[row][col]  = col-1;
	right_ptrs[row][col] = col+1;
    }
}